

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Buffer.cpp
# Opt level: O0

vector<char,_std::allocator<char>_> * __thiscall
Liby::Buffer::retriveveAsVector
          (vector<char,_std::allocator<char>_> *__return_storage_ptr__,Buffer *this,off_t len)

{
  char *pcVar1;
  long lVar2;
  long lVar3;
  off_t oVar4;
  allocator_type local_22;
  undefined1 local_21;
  off_t local_20;
  off_t len_local;
  Buffer *this_local;
  vector<char,_std::allocator<char>_> *ret;
  
  local_20 = len;
  len_local = (off_t)this;
  this_local = (Buffer *)__return_storage_ptr__;
  if (-1 < len) {
    if ((len == 0) || (oVar4 = size(this), oVar4 < len)) {
      retriveveAllAsVector(__return_storage_ptr__,this);
    }
    else {
      local_21 = 0;
      pcVar1 = this->buffer_;
      lVar2 = this->leftIndex_;
      lVar3 = this->rightIndex_;
      std::allocator<char>::allocator();
      std::vector<char,std::allocator<char>>::vector<char*,void>
                ((vector<char,std::allocator<char>> *)__return_storage_ptr__,pcVar1 + lVar2,
                 pcVar1 + lVar3,&local_22);
      std::allocator<char>::~allocator(&local_22);
      retrieve(this,local_20);
    }
    return __return_storage_ptr__;
  }
  __assert_fail("len >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/Buffer.cpp"
                ,0x106,"std::vector<char> Liby::Buffer::retriveveAsVector(off_t)");
}

Assistant:

std::vector<char> Buffer::retriveveAsVector(off_t len) {
    assert(len >= 0);
    if (len == 0 || len > size())
        return retriveveAllAsVector();
    std::vector<char> ret(&buffer_[leftIndex_], &buffer_[rightIndex_]);
    retrieve(len);
    return ret;
}